

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogramovserver.cpp
# Opt level: O2

void __thiscall HistogramOvserver::onNotified(HistogramOvserver *this)

{
  int i;
  int index;
  DataTable *this_00;
  int data;
  int local_1c;
  
  for (index = 0; this_00 = (this->super_DataTableObserver)._table,
      index < (int)((ulong)((long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2); index = index + 1)
  {
    DataTable::get(this_00,index,&local_1c);
    printData((HistogramOvserver *)this_00,local_1c,index);
  }
  return;
}

Assistant:

void HistogramOvserver::onNotified()
{
	for (int i = 0; i < _table->count(); ++i) {
		int data;
		_table->get(i, &data);
		printData(data, i);
	}
}